

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBufferHelper.cpp
# Opt level: O2

string * __thiscall
StringBufferHelper::GetNextSegmentBySeparator
          (string *__return_storage_ptr__,StringBufferHelper *this,string *separator)

{
  int iVar1;
  string currentBuffer;
  allocator local_41;
  string local_40 [32];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)this);
  iVar1 = std::__cxx11::string::find(local_40,(ulong)separator);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NA",&local_41);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_40);
    this->_currentPosition = this->_currentPosition + iVar1 + 1;
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

string StringBufferHelper::GetNextSegmentBySeparator(std::string separator) {
    string currentBuffer = _buffer.substr(_currentPosition, _buffer.size());
    int position = currentBuffer.find(separator);

    if (position == string::npos) {
        return "NA";
    }

    string segment = currentBuffer.substr(0, position);
    _currentPosition = _currentPosition + (position + 1);

    return segment;
}